

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

bool operator==(Matrix *lhs,Matrix *rhs)

{
  bool bVar1;
  Fraction *a;
  Fraction *b;
  int i;
  int j;
  int iVar2;
  
  iVar2 = lhs->n_;
  if (iVar2 == rhs->n_) {
    i = 0;
    if (lhs->m_ == rhs->m_) {
      for (; i < iVar2; i = i + 1) {
        iVar2 = 0;
        while (iVar2 < lhs->m_) {
          a = Matrix::At(lhs,i,iVar2);
          b = Matrix::At(rhs,i,iVar2);
          bVar1 = operator!=(a,b);
          iVar2 = iVar2 + 1;
          if (bVar1) goto LAB_00108adf;
        }
        iVar2 = lhs->n_;
      }
      i = 1;
    }
  }
  else {
LAB_00108adf:
    i = 0;
  }
  return SUB41(i,0);
}

Assistant:

int Matrix::GetNumRows() const {
  return n_;
}